

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O0

int EVclient_source_active(EVsource src)

{
  int iVar1;
  EVsource in_RDI;
  CManager_conflict cm;
  char *in_stack_00000008;
  int ret;
  
  IntCManager_lock((CManager)src,in_stack_00000008,cm._4_4_);
  iVar1 = INT_EVclient_source_active(in_RDI);
  IntCManager_unlock((CManager)src,in_stack_00000008,cm._4_4_);
  return iVar1;
}

Assistant:

extern int
EVclient_source_active ( EVsource src )
{
	int ret;
	CManager cm = src->cm;
	CManager_lock(cm);
	ret = INT_EVclient_source_active(src);
	CManager_unlock(cm);
	return ret;
}